

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::Flip(Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,
              uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *inYEnd,bool horizontal,
              bool vertical,uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uchar *puVar3;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  undefined1 (*in_stack_00000010) [16];
  uint8_t *inXEnd_1;
  uint8_t *outX_1;
  uint8_t *inX_1;
  simd *inXEndSimd_1;
  simd *outXSimd_1;
  simd *inXSimd_1;
  uint8_t *outY_2;
  uint8_t *outYSimd_1;
  uint8_t *outY_1;
  uint8_t *inXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd *inXEndSimd;
  simd *outXSimd;
  simd *inXSimd;
  uint8_t *outY;
  uint8_t *outYSimd;
  simd ctrl;
  uchar *local_1a8;
  uchar *local_1a0;
  uchar *local_190;
  undefined1 (*local_188) [16];
  uchar *local_180;
  uchar *local_178;
  uchar *local_170;
  uchar *local_160;
  uchar *local_158;
  uchar *local_148;
  undefined1 (*local_140) [16];
  uchar *local_138;
  uchar *local_130;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  auVar1 = vpinsrb_avx(ZEXT116(0xf),0xe,1);
  auVar1 = vpinsrb_avx(auVar1,0xd,2);
  auVar1 = vpinsrb_avx(auVar1,0xc,3);
  auVar1 = vpinsrb_avx(auVar1,0xb,4);
  auVar1 = vpinsrb_avx(auVar1,10,5);
  auVar1 = vpinsrb_avx(auVar1,9,6);
  auVar1 = vpinsrb_avx(auVar1,8,7);
  auVar1 = vpinsrb_avx(auVar1,7,8);
  auVar1 = vpinsrb_avx(auVar1,6,9);
  auVar1 = vpinsrb_avx(auVar1,5,10);
  auVar1 = vpinsrb_avx(auVar1,4,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,2,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auVar1 = vpinsrb_avx(auVar1,0,0xf);
  if ((((byte)outX_1 & 1) == 0) || (((byte)inX_1 & 1) != 0)) {
    if ((((byte)outX_1 & 1) == 0) && (((byte)inX_1 & 1) != 0)) {
      local_170 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
      local_170 = local_170 + (ulong)in_ESI + (ulong)((in_EDX + in_R8D + -1) * in_stack_00000008);
      for (; in_stack_00000010 != (undefined1 (*) [16])inXEnd_1;
          in_stack_00000010 = (undefined1 (*) [16])(*in_stack_00000010 + in_R9D)) {
        memcpy(local_170,in_stack_00000010,(ulong)in_ECX);
        local_170 = local_170 + -(ulong)in_stack_00000008;
      }
    }
    else {
      local_178 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
      local_178 = local_178 +
                  (ulong)in_ECX +
                  (ulong)in_ESI + (ulong)((in_EDX + in_R8D + -1) * in_stack_00000008) + -0x10;
      local_180 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
      local_180 = local_180 +
                  (ulong)in_ECX +
                  (ulong)in_ESI + (ulong)((in_EDX + in_R8D + -1) * in_stack_00000008) + -1;
      for (; in_stack_00000010 != (undefined1 (*) [16])inXEnd_1;
          in_stack_00000010 = (undefined1 (*) [16])(*in_stack_00000010 + in_R9D)) {
        local_190 = local_178;
        for (local_188 = in_stack_00000010; local_188 != in_stack_00000010 + (uint)inXEndSimd_1;
            local_188 = local_188 + 1) {
          auVar2 = vpshufb_avx(*local_188,auVar1);
          local_e8 = auVar2._0_8_;
          uStack_e0 = auVar2._8_8_;
          *(undefined8 *)local_190 = local_e8;
          *(undefined8 *)(local_190 + 8) = uStack_e0;
          local_190 = local_190 + -0x10;
        }
        if ((uint)inXSimd_1 != 0) {
          local_1a0 = *in_stack_00000010 + (uint)outXSimd_1;
          local_1a8 = local_180 + -(ulong)(uint)outXSimd_1;
          puVar3 = local_1a0 + (uint)inXSimd_1;
          for (; local_1a0 != puVar3; local_1a0 = local_1a0 + 1) {
            *local_1a8 = *local_1a0;
            local_1a8 = local_1a8 + -1;
          }
        }
        local_180 = local_180 + -(ulong)in_stack_00000008;
        local_178 = local_178 + -(ulong)in_stack_00000008;
      }
    }
  }
  else {
    local_130 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    local_130 = local_130 +
                (ulong)in_ECX + (ulong)in_ESI + (ulong)(in_EDX * in_stack_00000008) + -0x10;
    local_138 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    local_138 = local_138 + (ulong)in_ECX + (ulong)in_ESI + (ulong)(in_EDX * in_stack_00000008) + -1
    ;
    for (; in_stack_00000010 != (undefined1 (*) [16])inXEnd_1;
        in_stack_00000010 = (undefined1 (*) [16])(*in_stack_00000010 + in_R9D)) {
      local_148 = local_130;
      for (local_140 = in_stack_00000010; local_140 != in_stack_00000010 + (uint)inXEndSimd_1;
          local_140 = local_140 + 1) {
        auVar2 = vpshufb_avx(*local_140,auVar1);
        local_c8 = auVar2._0_8_;
        uStack_c0 = auVar2._8_8_;
        *(undefined8 *)local_148 = local_c8;
        *(undefined8 *)(local_148 + 8) = uStack_c0;
        local_148 = local_148 + -0x10;
      }
      if ((uint)inXSimd_1 != 0) {
        local_158 = *in_stack_00000010 + (uint)outXSimd_1;
        local_160 = local_138 + -(ulong)(uint)outXSimd_1;
        puVar3 = local_158 + (uint)inXSimd_1;
        for (; local_158 != puVar3; local_158 = local_158 + 1) {
          *local_160 = *local_158;
          local_160 = local_160 + -1;
        }
      }
      local_138 = local_138 + in_stack_00000008;
      local_130 = local_130 + in_stack_00000008;
    }
  }
  return;
}

Assistant:

void Flip( Image_Function::Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, const uint32_t rowSizeIn, 
               const uint32_t rowSizeOut, const uint8_t * inY, const uint8_t * inYEnd, bool horizontal, bool vertical, const uint32_t simdWidth, 
               const uint32_t totalSimdWidth, const uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm_setr_epi8( 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0 );

        if( horizontal && !vertical ) {
            uint8_t * outYSimd = out.data() + startYOut * rowSizeOut + startXOut + width - simdSize;
            uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

            for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut, outYSimd += rowSizeOut ) {
                const simd * inXSimd    = reinterpret_cast<const simd*>(inY);
                simd       * outXSimd   = reinterpret_cast<simd*>(outYSimd);
                const simd * inXEndSimd = inXSimd + simdWidth;

                for( ; inXSimd != inXEndSimd; ++inXSimd, --outXSimd )
                    _mm_storeu_si128( outXSimd, _mm_shuffle_epi8( _mm_loadu_si128( inXSimd ), ctrl ) );
                        
                if(nonSimdWidth > 0)
                {
                    const uint8_t * inX    = inY + totalSimdWidth;
                    uint8_t       * outX   = outY - totalSimdWidth;
                    const uint8_t * inXEnd = inX + nonSimdWidth;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
        else if( !horizontal && vertical ) {
            uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

            for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                memcpy( outY, inY, sizeof( uint8_t ) * width );
        }
        else {
            uint8_t * outYSimd = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - simdSize;
            uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

            for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut, outYSimd -= rowSizeOut ) {
                const simd * inXSimd    = reinterpret_cast<const simd*>(inY);
                simd       * outXSimd   = reinterpret_cast<simd*>(outYSimd);
                const simd * inXEndSimd = inXSimd + simdWidth;

                for( ; inXSimd != inXEndSimd; ++inXSimd, --outXSimd )
                    _mm_storeu_si128( outXSimd, _mm_shuffle_epi8( _mm_loadu_si128( inXSimd ), ctrl ) );
                        
                if(nonSimdWidth > 0)
                {
                    const uint8_t * inX    = inY + totalSimdWidth;
                    uint8_t       * outX   = outY - totalSimdWidth;
                    const uint8_t * inXEnd = inX + nonSimdWidth;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }